

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

bool CLI::detail::valid_first_char<char>(char c)

{
  bool bVar1;
  byte bVar2;
  locale alStack_18 [8];
  
  ::std::locale::locale(alStack_18);
  bVar1 = std::isalnum<char>(c,alStack_18);
  bVar2 = 1;
  if (!bVar1) {
    if ((byte)(c - 0x3fU) < 0x21) {
      bVar2 = (byte)(0x100000003 >> (c - 0x3fU & 0x3f));
    }
    else {
      bVar2 = 0;
    }
  }
  ::std::locale::~locale(alStack_18);
  return (bool)(bVar2 & 1);
}

Assistant:

bool valid_first_char(T c) {
    return std::isalnum(c, std::locale()) || c == '_' || c == '?' || c == '@';
}